

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_predict.c
# Opt level: O0

int PredictorVGetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  undefined4 uVar1;
  uint uVar2;
  uint8_t *puVar3;
  undefined8 *local_50;
  TIFFPredictorState *sp;
  __va_list_tag *ap_local;
  uint32_t tag_local;
  TIFF *tif_local;
  
  puVar3 = tif->tif_data;
  if (puVar3 == (uint8_t *)0x0) {
    __assert_fail("sp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_predict.c"
                  ,0x3b9,"int PredictorVGetField(TIFF *, uint32_t, struct __va_list_tag *)");
  }
  if (*(long *)(puVar3 + 0x58) != 0) {
    if (tag == 0x13d) {
      uVar1 = *(undefined4 *)puVar3;
      uVar2 = ap->gp_offset;
      if (uVar2 < 0x29) {
        local_50 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
        ap->gp_offset = uVar2 + 8;
      }
      else {
        local_50 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_50 + 1;
      }
      *(short *)*local_50 = (short)uVar1;
      tif_local._4_4_ = 1;
    }
    else {
      tif_local._4_4_ = (**(code **)(puVar3 + 0x58))(tif,tag,ap);
    }
    return tif_local._4_4_;
  }
  __assert_fail("sp->vgetparent != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_predict.c"
                ,0x3ba,"int PredictorVGetField(TIFF *, uint32_t, struct __va_list_tag *)");
}

Assistant:

static int PredictorVGetField(TIFF *tif, uint32_t tag, va_list ap)
{
    TIFFPredictorState *sp = PredictorState(tif);

    assert(sp != NULL);
    assert(sp->vgetparent != NULL);

    switch (tag)
    {
        case TIFFTAG_PREDICTOR:
            *va_arg(ap, uint16_t *) = (uint16_t)sp->predictor;
            break;
        default:
            return (*sp->vgetparent)(tif, tag, ap);
    }
    return 1;
}